

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.cpp
# Opt level: O2

char * __thiscall CNscContext::GetTypeName(CNscContext *this,NscType nType)

{
  char *pcVar1;
  NscSymbol *pNVar2;
  
  if (nType < (NscType_Vector|NscType_Void)) {
    pcVar1 = &DAT_0017e7b4 + *(int *)(&DAT_0017e7b4 + (ulong)nType * 4);
  }
  else if ((nType & ~(NscType_String|NscType_Float)) == NscType_Engine_0) {
    pcVar1 = this->m_pCompiler->m_CompilerState->m_astrNscEngineTypes[nType - NscType_Engine_0].
             _M_dataplus._M_p;
  }
  else if ((int)nType < 0x20) {
    pcVar1 = "[invalid type]";
  }
  else {
    pNVar2 = GetStructSymbol(this,nType);
    if (pNVar2 == (NscSymbol *)0x0) {
      __assert_fail("pSymbol != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscContext.cpp"
                    ,0xf82,"const char *CNscContext::GetTypeName(NscType)");
    }
    pcVar1 = pNVar2->szString;
  }
  return pcVar1;
}

Assistant:

const char *CNscContext::GetTypeName (NscType nType)
{

	//
	// Switch based on the type
	//

	switch (nType)
	{
		case NscType_Unknown:
			return "[unknown]";
		case NscType_Void:
			return "void";
		case NscType_Error:
			return "[error]";
		case NscType_Action:
			return "action";
		case NscType_Statement:
			return "[statement]";
		case NscType_Struct:
			return "[struct]";
		case NscType_Integer:
			return "int";
		case NscType_Float:
			return "float";
		case NscType_String:
			return "string";
		case NscType_Object:
			return "object";
		case NscType_Vector:
			return "vector";

		//
		// Default case catches all the other types
		//

		default:

			//
			// If this is an engine type
			//

			if (nType >= NscType_Engine_0 &&
				nType < NscType_Struct_0)
			{
				return GetCompilerState () ->m_astrNscEngineTypes [nType - NscType_Engine_0] .c_str ();
			}

			//
			// If we have a structure
			//

			else if (nType >= NscType_Struct_0)
			{

				//
				// Loop through the values in the structure
				// and add them as variables.
				//

				NscSymbol *pSymbol = GetStructSymbol (nType);
				assert (pSymbol != NULL);
				return pSymbol ->szString;
			}

			//
			// Otherwise, error.  Unknown type
			//

			else
			{
				return "[invalid type]";
			}
	}
}